

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O0

void __thiscall
QPDFExc::QPDFExc(QPDFExc *this,qpdf_error_code_e error_code,string *filename,string *object,
                qpdf_offset_t offset,string *message)

{
  string *local_b0;
  qpdf_offset_t local_88;
  string local_58;
  string *local_38;
  string *message_local;
  qpdf_offset_t offset_local;
  string *object_local;
  string *filename_local;
  QPDFExc *pQStack_10;
  qpdf_error_code_e error_code_local;
  QPDFExc *this_local;
  
  local_88 = offset;
  if (offset == 0) {
    local_88 = -1;
  }
  local_38 = message;
  message_local = (string *)offset;
  offset_local = (qpdf_offset_t)object;
  object_local = filename;
  filename_local._4_4_ = error_code;
  pQStack_10 = this;
  createWhat(&local_58,filename,object,local_88,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__QPDFExc_0058ab98;
  this->error_code = filename_local._4_4_;
  std::__cxx11::string::string((string *)&this->filename,(string *)object_local);
  std::__cxx11::string::string((string *)&this->object,(string *)offset_local);
  if (message_local == (string *)0x0) {
    local_b0 = (string *)0xffffffffffffffff;
  }
  else {
    local_b0 = message_local;
  }
  this->offset = (qpdf_offset_t)local_b0;
  std::__cxx11::string::string((string *)&this->message,(string *)local_38);
  return;
}

Assistant:

QPDFExc::QPDFExc(
    qpdf_error_code_e error_code,
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message) :
    std::runtime_error(createWhat(filename, object, (offset ? offset : -1), message)),
    error_code(error_code),
    filename(filename),
    object(object),
    offset(offset ? offset : -1),
    message(message)
{
}